

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

int __thiscall JetHead::Path::remove(Path *this,char *__filename)

{
  char *__name;
  bool bVar1;
  int iVar2;
  ErrCode EVar3;
  int *piVar4;
  
  bVar1 = isDir(this);
  __name = (this->mPath)._M_dataplus._M_p;
  if (bVar1) {
    iVar2 = rmdir(__name);
  }
  else {
    iVar2 = unlink(__name);
  }
  if (iVar2 != 0) {
    piVar4 = __errno_location();
    EVar3 = getErrorCode(*piVar4);
    return EVar3;
  }
  return 0;
}

Assistant:

ErrCode Path::remove()
{
	int res = 0;
	if ( isDir() )
	{
		LOG_NOISE( "Removing Dir" );
		res = ::rmdir( mPath.c_str() );
	}
	else
	{
		LOG_NOISE( "Removing File" );
		res = ::unlink( mPath.c_str() );
	}
	
	if ( res != 0 )
	{
		return getErrorCode( errno );
	}
	
	return kNoError;
}